

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

DebugMLTSampler *
pbrt::DebugMLTSampler::Create
          (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           state,int nSampleStreams)

{
  bool bVar1;
  float *pfVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  DebugMLTSampler *in_RDI;
  size_t i;
  DebugMLTSampler *ds;
  int in_stack_ffffffffffffff6c;
  DebugMLTSampler *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff88;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff90;
  DebugMLTSampler *fmt;
  float *pfVar3;
  float *ptr;
  string_view in_stack_ffffffffffffffd0;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  fmt = in_RDI;
  DebugMLTSampler(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::size(&local_18);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pfVar3 = (float *)0x0;
  while( true ) {
    ptr = pfVar3;
    pfVar2 = (float *)pstd::
                      span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::size(&local_18);
    if (pfVar2 <= pfVar3) {
      return in_RDI;
    }
    this = pstd::
           span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](&local_18,(size_t)ptr);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    std::vector<float,_std::allocator<float>_>::operator[](&fmt->u,(size_type)ptr);
    bVar1 = Atof(in_stack_ffffffffffffffd0,ptr);
    if (!bVar1) break;
    pfVar3 = (float *)((long)ptr + 1);
  }
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator[](&local_18,(size_t)ptr);
  ErrorExit<std::__cxx11::string_const&>
            ((char *)fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI
            );
}

Assistant:

DebugMLTSampler DebugMLTSampler::Create(pstd::span<const std::string> state,
                                        int nSampleStreams) {
    DebugMLTSampler ds(nSampleStreams);
    ds.u.resize(state.size());
    for (size_t i = 0; i < state.size(); ++i) {
#ifdef PBRT_FLOAT_AS_DOUBLE
        if (!Atod(state[i], &ds.u[i]))
#else
        if (!Atof(state[i], &ds.u[i]))
#endif
            ErrorExit("Invalid value in --debugstate: %s", state[i]);
    }
    return ds;
}